

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O0

void __thiscall
cubeb_resampler_passthrough_input_only_Test::TestBody
          (cubeb_resampler_passthrough_input_only_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar;
  long frames;
  uint32_t i;
  long got;
  float input_buffer [512];
  cubeb_resampler *resampler;
  int target_rate;
  size_t input_channels;
  cubeb_stream_params input_params;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffff76c;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffff774;
  long *in_stack_fffffffffffff778;
  undefined4 in_stack_fffffffffffff780;
  undefined4 in_stack_fffffffffffff784;
  uint uVar4;
  undefined4 in_stack_fffffffffffff788;
  int in_stack_fffffffffffff78c;
  undefined4 in_stack_fffffffffffff790;
  uint in_stack_fffffffffffff794;
  undefined4 in_stack_fffffffffffff798;
  undefined4 in_stack_fffffffffffff79c;
  Type type;
  cubeb_stream_params *in_stack_fffffffffffff7a0;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in_stack_fffffffffffff7a8;
  uint local_844;
  cubeb_resampler_quality in_stack_fffffffffffff7c0;
  cubeb_resampler_reclock in_stack_fffffffffffff7c8;
  Message *in_stack_fffffffffffff7e8;
  AssertHelper *in_stack_fffffffffffff7f0;
  
  uVar2 = 0;
  uVar3 = 0;
  cubeb_resampler_create
            ((cubeb_stream *)
             in_stack_fffffffffffff7a8._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,in_stack_fffffffffffff7a0,
             (cubeb_stream_params *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
             in_stack_fffffffffffff794,
             (cubeb_data_callback)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
             (void *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
             in_stack_fffffffffffff7c0,in_stack_fffffffffffff7c8);
  local_844 = 0;
  while( true ) {
    if (0x1d < local_844) {
      cubeb_resampler_destroy((cubeb_resampler *)CONCAT44(in_stack_fffffffffffff774,uVar3));
      return;
    }
    cubeb_resampler_fill
              ((cubeb_resampler *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
               in_stack_fffffffffffff778,(long *)CONCAT44(in_stack_fffffffffffff774,uVar3),
               (void *)CONCAT44(in_stack_fffffffffffff76c,uVar2),0x110104);
    type = 0x100;
    testing::internal::EqHelper::Compare<long,_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
               (char *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
               in_stack_fffffffffffff778,(int *)CONCAT44(in_stack_fffffffffffff774,uVar3));
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffff7a0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff7a0);
      testing::AssertionResult::failure_message((AssertionResult *)0x110159);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff7a0,type,
                 (char *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
                 in_stack_fffffffffffff78c,
                 (char *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff774,uVar3));
      testing::Message::~Message((Message *)0x11019a);
    }
    uVar4 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1101b6);
    if (uVar4 != 0) break;
    local_844 = local_844 + 1;
    in_stack_fffffffffffff784 = 0;
  }
  return;
}

Assistant:

TEST(cubeb, resampler_passthrough_input_only)
{
  // Test that the passthrough resampler works when there is only an output
  // stream.
  cubeb_stream_params input_params;

  const size_t input_channels = 2;
  input_params.channels = input_channels;
  input_params.rate = 44100;
  input_params.format = CUBEB_SAMPLE_FLOAT32NE;
  int target_rate = input_params.rate;

  cubeb_resampler * resampler = cubeb_resampler_create(
      (cubeb_stream *)nullptr, &input_params, nullptr, target_rate,
      cb_passthrough_resampler_input, nullptr, CUBEB_RESAMPLER_QUALITY_VOIP,
      CUBEB_RESAMPLER_RECLOCK_NONE);

  float input_buffer[input_channels * 256];

  long got;
  for (uint32_t i = 0; i < 30; i++) {
    long int frames = 256;
    got = cubeb_resampler_fill(resampler, input_buffer, &frames, nullptr, 0);
    ASSERT_EQ(got, 256);
  }

  cubeb_resampler_destroy(resampler);
}